

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZEqnArray<double>_>::Resize
          (TPZVec<TPZEqnArray<double>_> *this,int64_t newsize,TPZEqnArray<double> *object)

{
  undefined1 auVar1 [16];
  int64_t *piVar2;
  ostream *poVar3;
  TPZEqnArray<double> *pTVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  TPZEqnArray<double> *pTVar9;
  
  if (newsize < 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::ostream::flush();
    return;
  }
  lVar7 = this->fNElements;
  if (lVar7 != newsize) {
    if (newsize == 0) {
      pTVar9 = (TPZEqnArray<double> *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = newsize;
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x3290),8) == 0) {
        uVar6 = SUB168(auVar1 * ZEXT816(0x3290),0) | 8;
      }
      piVar2 = (int64_t *)operator_new__(uVar6);
      *piVar2 = newsize;
      pTVar9 = (TPZEqnArray<double> *)(piVar2 + 1);
      lVar7 = 0;
      pTVar4 = pTVar9;
      do {
        TPZEqnArray<double>::TPZEqnArray(pTVar4);
        lVar7 = lVar7 + -0x3290;
        pTVar4 = pTVar4 + 1;
      } while (newsize * -0x3290 - lVar7 != 0);
      lVar7 = this->fNElements;
    }
    if (newsize <= lVar7) {
      lVar7 = newsize;
    }
    lVar8 = 0;
    lVar5 = lVar7;
    if (lVar7 < 1) {
      lVar7 = lVar8;
      lVar5 = lVar8;
    }
    while (lVar7 != 0) {
      TPZEqnArray<double>::operator=
                ((TPZEqnArray<double> *)
                 ((long)(pTVar9->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar8 + -0x28),
                 (TPZEqnArray<double> *)
                 ((long)(this->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                 lVar8 + -0x28));
      lVar8 = lVar8 + 0x3290;
      lVar7 = lVar7 + -1;
    }
    pTVar4 = pTVar9 + lVar5;
    for (; lVar5 < newsize; lVar5 = lVar5 + 1) {
      TPZEqnArray<double>::operator=(pTVar4,object);
      pTVar4 = pTVar4 + 1;
    }
    pTVar4 = this->fStore;
    if (pTVar4 != (TPZEqnArray<double> *)0x0) {
      lVar7 = *(long *)&pTVar4[-1].fLastTerm;
      if (lVar7 != 0) {
        lVar5 = lVar7 * 0x3290;
        do {
          TPZEqnArray<double>::~TPZEqnArray
                    ((TPZEqnArray<double> *)
                     ((long)pTVar4[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28));
          lVar5 = lVar5 + -0x3290;
        } while (lVar5 != 0);
      }
      operator_delete__(&pTVar4[-1].fLastTerm,lVar7 * 0x3290 | 8);
      this->fStore = (TPZEqnArray<double> *)0x0;
    }
    this->fStore = pTVar9;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}